

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesBoolWidget.cxx
# Opt level: O2

void __thiscall cmCursesBoolWidget::SetValueAsBool(cmCursesBoolWidget *this,bool value)

{
  bool bVar1;
  chtype attr;
  undefined7 in_register_00000031;
  allocator<char> local_31;
  string local_30 [32];
  
  if ((int)CONCAT71(in_register_00000031,value) == 0) {
    std::__cxx11::string::string<std::allocator<char>>(local_30,"OFF",&local_31);
    (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[4])(this,local_30);
    std::__cxx11::string::~string(local_30);
    attr = 0x100;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>(local_30,"ON",&local_31);
    (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[4])(this,local_30);
    std::__cxx11::string::~string(local_30);
    attr = 0x200;
  }
  bVar1 = cmCursesColor::HasColors();
  if (bVar1) {
    set_field_fore((this->super_cmCursesWidget).Field,attr);
    set_field_back((this->super_cmCursesWidget).Field,attr);
  }
  return;
}

Assistant:

void cmCursesBoolWidget::SetValueAsBool(bool value)
{
  if (value) {
    this->SetValue("ON");
    if (cmCursesColor::HasColors()) {
      set_field_fore(this->Field, COLOR_PAIR(cmCursesColor::BoolOn));
      set_field_back(this->Field, COLOR_PAIR(cmCursesColor::BoolOn));
    }
  } else {
    this->SetValue("OFF");
    if (cmCursesColor::HasColors()) {
      set_field_fore(this->Field, COLOR_PAIR(cmCursesColor::BoolOff));
      set_field_back(this->Field, COLOR_PAIR(cmCursesColor::BoolOff));
    }
  }
}